

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxInByHandle(void *handle,void *tx_data_handle,uint32_t index,char **txid,uint32_t *vout,
                      uint32_t *sequence,char **script_sig)

{
  uint32_t uVar1;
  undefined8 uVar2;
  undefined8 *in_RCX;
  uint32_t in_EDX;
  long in_RSI;
  uint32_t *in_R8;
  uint32_t *in_R9;
  undefined8 *in_stack_00000008;
  CfdException *except;
  exception *std_except;
  ConfidentialTxInReference ref_1;
  ConfidentialTransactionContext *tx_1;
  TxInReference ref;
  TransactionContext *tx;
  Script temp_unlocking_script;
  Txid temp_txid;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  int result;
  char *work_script_sig;
  char *work_txid;
  AbstractTxInReference *in_stack_fffffffffffffb98;
  ConfidentialTxInReference *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffbb0;
  CfdError in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  bool *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc04;
  string local_3e8;
  Script local_3c8;
  Txid local_390;
  string *in_stack_fffffffffffffca8;
  pointer in_stack_fffffffffffffcb0;
  Script local_208;
  Txid local_1d0;
  AbstractTxInReference local_1b0;
  Transaction *local_120;
  undefined1 local_112;
  allocator local_111;
  string local_110 [32];
  Script local_f0;
  Txid local_b8;
  byte local_91;
  long local_90;
  allocator local_81;
  string local_80 [52];
  undefined4 local_4c;
  char *local_48;
  char *local_40;
  uint32_t *local_38;
  uint32_t *local_30;
  undefined8 *local_28;
  uint32_t local_1c;
  long local_18;
  int local_4;
  
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_4c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"TransactionData",&local_81);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_90 = local_18;
  local_91 = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffffc04,in_stack_fffffffffffffbf8);
  cfd::core::Txid::Txid(&local_b8);
  cfd::core::Script::Script(&local_f0);
  if (*(long *)(local_90 + 0x18) == 0) {
    local_112 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Invalid handle state. tx is null",&local_111);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
               in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb0);
    local_112 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_91 & 1) == 0) {
    cfd::core::ConfidentialTransaction::GetTxIn
              ((ConfidentialTxInReference *)&stack0xfffffffffffffc90,
               *(ConfidentialTransaction **)(local_90 + 0x18),local_1c);
    cfd::core::AbstractTxInReference::GetTxid(in_stack_fffffffffffffb98);
    cfd::core::Txid::operator=(&local_b8,&local_390);
    cfd::core::Txid::~Txid((Txid *)0x65f45c);
    cfd::core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffffb98);
    cfd::core::Script::operator=(&local_f0,&local_3c8);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffffba0);
    if (local_30 != (uint32_t *)0x0) {
      uVar1 = cfd::core::AbstractTxInReference::GetVout
                        ((AbstractTxInReference *)&stack0xfffffffffffffc90);
      *local_30 = uVar1;
    }
    if (local_38 != (uint32_t *)0x0) {
      uVar1 = cfd::core::AbstractTxInReference::GetSequence
                        ((AbstractTxInReference *)&stack0xfffffffffffffc90);
      *local_38 = uVar1;
    }
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffba0);
  }
  else {
    local_120 = *(Transaction **)(local_90 + 0x18);
    cfd::core::Transaction::GetTxIn((TxInReference *)&local_1b0,local_120,local_1c);
    cfd::core::AbstractTxInReference::GetTxid(in_stack_fffffffffffffb98);
    cfd::core::Txid::operator=(&local_b8,&local_1d0);
    cfd::core::Txid::~Txid((Txid *)0x65f2ba);
    cfd::core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffffb98);
    cfd::core::Script::operator=(&local_f0,&local_208);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffffba0);
    if (local_30 != (uint32_t *)0x0) {
      uVar1 = cfd::core::AbstractTxInReference::GetVout(&local_1b0);
      *local_30 = uVar1;
    }
    if (local_38 != (uint32_t *)0x0) {
      uVar1 = cfd::core::AbstractTxInReference::GetSequence(&local_1b0);
      *local_38 = uVar1;
    }
    cfd::core::TxInReference::~TxInReference((TxInReference *)0x65f3d8);
  }
  if (local_28 != (undefined8 *)0x0) {
    cfd::core::Txid::GetHex_abi_cxx11_(&local_3e8,&local_b8);
    local_40 = cfd::capi::CreateString
                         ((string *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    std::__cxx11::string::~string((string *)&local_3e8);
  }
  if (in_stack_00000008 != (undefined8 *)0x0) {
    cfd::core::Script::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffbf8,&local_f0);
    local_48 = cfd::capi::CreateString
                         ((string *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbf8);
  }
  if (local_40 != (char *)0x0) {
    *local_28 = local_40;
  }
  if (local_48 != (char *)0x0) {
    *in_stack_00000008 = local_48;
  }
  local_4 = 0;
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffffba0);
  cfd::core::Txid::~Txid((Txid *)0x65f6b9);
  return local_4;
}

Assistant:

int CfdGetTxInByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** txid,
    uint32_t* vout, uint32_t* sequence, char** script_sig) {
  char* work_txid = nullptr;
  char* work_script_sig = nullptr;
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    Txid temp_txid;
    Script temp_unlocking_script;
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxInReference ref = tx->GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxInReference ref = tx->GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (txid != nullptr) {
      work_txid = CreateString(temp_txid.GetHex());
    }
    if (script_sig != nullptr) {
      work_script_sig = CreateString(temp_unlocking_script.GetHex());
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_script_sig != nullptr) *script_sig = work_script_sig;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_script_sig);
  return result;
}